

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmContinue(LlvmCompilationContext *ctx,ExprContinue *node)

{
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  GetLoopContinueBlock(ctx,*(uint *)&(node->super_ExprBase).field_0x2c);
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmContinue(LlvmCompilationContext &ctx, ExprContinue *node)
{
	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef target = GetLoopContinueBlock(ctx, node->depth);

	LLVMBuildBr(ctx.builder, target);

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_continue");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}